

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

void * mpc_realloc(mpc_input_t *i,void *p,size_t n)

{
  int iVar1;
  mpc_input_t *in_RDX;
  void *in_RSI;
  mpc_input_t *in_RDI;
  char *q;
  void *local_8;
  
  iVar1 = mpc_mem_ptr(in_RDI,in_RSI);
  if (iVar1 == 0) {
    local_8 = realloc(in_RSI,(size_t)in_RDX);
  }
  else {
    local_8 = in_RSI;
    if ((mpc_input_t *)0x40 < in_RDX) {
      local_8 = malloc((size_t)in_RDX);
      memcpy(local_8,in_RSI,0x40);
      mpc_free(in_RDX,local_8);
    }
  }
  return local_8;
}

Assistant:

static void *mpc_realloc(mpc_input_t *i, void *p, size_t n) {

  char *q = NULL;

  if (!mpc_mem_ptr(i, p)) { return realloc(p, n); }

  if (n > sizeof(mpc_mem_t)) {
    q = malloc(n);
    memcpy(q, p, sizeof(mpc_mem_t));
    mpc_free(i, p);
    return q;
  }

  return p;
}